

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonDom.cc
# Opt level: O0

Entity avro::json::loadEntity(InputStream *in)

{
  any extraout_RDX;
  EVP_PKEY_CTX *in_RSI;
  JsonParser *in_RDI;
  Entity EVar1;
  JsonParser p;
  JsonParser *this;
  JsonParser *this_00;
  JsonParser local_b8;
  EVP_PKEY_CTX *local_10;
  
  this_00 = &local_b8;
  this = in_RDI;
  local_10 = in_RSI;
  JsonParser::JsonParser(this_00);
  JsonParser::init(this_00,local_10);
  readEntity((JsonParser *)
             p.stateStack.c.
             super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node);
  JsonParser::~JsonParser(this);
  EVar1.value_.content = extraout_RDX.content;
  EVar1._0_8_ = in_RDI;
  return EVar1;
}

Assistant:

Entity loadEntity(InputStream& in)
{
    JsonParser p;
    p.init(in);
    return readEntity(p);
}